

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O3

AnalyzedReferences * __thiscall
jaegertracing::Tracer::analyzeReferences
          (AnalyzedReferences *__return_storage_ptr__,Tracer *this,
          vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
          *references)

{
  uint64_t *puVar1;
  Type TVar2;
  Type *pTVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  element_type *peVar6;
  SpanContext *pSVar7;
  bool bVar8;
  SpanContext *ctx;
  Type *pTVar9;
  bool bVar10;
  SpanContext *local_118;
  Reference local_e8;
  
  (__return_storage_ptr__->_references).
  super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_references).
  super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->_parent = (SpanContext *)0x0;
  __return_storage_ptr__->_self = (SpanContext *)0x0;
  (__return_storage_ptr__->_references).
  super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar9 = *(Type **)references;
  pTVar3 = *(Type **)(references + 8);
  if (pTVar9 != pTVar3) {
    puVar1 = &local_e8._spanContext._traceID._low;
    bVar10 = false;
    local_118 = (SpanContext *)0x0;
    do {
      pSVar7 = local_118;
      bVar8 = bVar10;
      if ((*(undefined8 *)(pTVar9 + 2) == 0) ||
         (ctx = (SpanContext *)
                __dynamic_cast(*(undefined8 *)(pTVar9 + 2),&opentracing::v3::SpanContext::typeinfo,
                               &SpanContext::typeinfo,0), ctx == (SpanContext *)0x0)) {
        peVar6 = (this->_logger).
                 super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_e8._spanContext.super_SpanContext._vptr_SpanContext = (_func_int **)puVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"Reference contains invalid type of SpanReference","");
        (*peVar6->_vptr_Logger[2])(peVar6,&local_e8);
        if (local_e8._spanContext.super_SpanContext._vptr_SpanContext != (_func_int **)puVar1) {
          operator_delete(local_e8._spanContext.super_SpanContext._vptr_SpanContext);
        }
      }
      else {
        uVar4 = (ctx->_traceID)._high;
        uVar5 = (ctx->_traceID)._low;
        if ((((uVar4 != 0 || uVar5 != 0) && (ctx->_spanID != 0)) ||
            ((uVar4 == 0 && ((uVar5 == 0 && ((ctx->_debugID)._M_string_length != 0)))))) ||
           ((ctx->_baggage)._M_h._M_element_count != 0)) {
          TVar2 = *pTVar9;
          if (TVar2 == 99) {
            __return_storage_ptr__->_self = ctx;
          }
          else {
            SpanContext::SpanContext(&local_e8._spanContext,ctx);
            local_e8._type = TVar2;
            std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::
            emplace_back<jaegertracing::Reference>(&__return_storage_ptr__->_references,&local_e8);
            local_e8._spanContext.super_SpanContext._vptr_SpanContext =
                 (_func_int **)&PTR__SpanContext_00264a78;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._spanContext._debugID._M_dataplus._M_p !=
                &local_e8._spanContext._debugID.field_2) {
              operator_delete(local_e8._spanContext._debugID._M_dataplus._M_p);
            }
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_e8._spanContext._baggage._M_h);
            pSVar7 = ctx;
            bVar8 = *pTVar9 == ChildOfRef;
            if (bVar10) {
              pSVar7 = local_118;
              bVar8 = bVar10;
            }
          }
        }
      }
      bVar10 = bVar8;
      local_118 = pSVar7;
      pTVar9 = pTVar9 + 4;
    } while (pTVar9 != pTVar3);
    if ((!bVar10) && (local_118 != (SpanContext *)0x0)) {
      bVar10 = ((local_118->_traceID)._low != 0 || (local_118->_traceID)._high != 0) &&
               local_118->_spanID != 0;
    }
    if (bVar10) {
      if (local_118 == (SpanContext *)0x0) {
        __assert_fail("parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/Tracer.cpp"
                      ,0xef,
                      "Tracer::AnalyzedReferences jaegertracing::Tracer::analyzeReferences(const std::vector<OpenTracingRef> &) const"
                     );
      }
      __return_storage_ptr__->_parent = local_118;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Tracer::AnalyzedReferences
Tracer::analyzeReferences(const std::vector<OpenTracingRef>& references) const
{
    AnalyzedReferences result;
    auto hasParent = false;
    const auto* parent = result._parent;
    for (auto&& ref : references) {
        const auto* ctx = dynamic_cast<const SpanContext*>(ref.second);

        if (!ctx) {
            _logger->error("Reference contains invalid type of SpanReference");
            continue;
        }

        if (!ctx->isValid() && !ctx->isDebugIDContainerOnly() &&
            ctx->baggage().empty()) {
            continue;
        }

        if (static_cast<int>(ref.first) == SpanReferenceType_JaegerSpecific_SelfRef)
        {
            result._self = ctx;
            continue; // not a reference
        }

        result._references.emplace_back(Reference(*ctx, ref.first));

        if (!hasParent) {
            parent = ctx;
            hasParent =
                (ref.first == opentracing::SpanReferenceType::ChildOfRef);
        }
    }

    if (!hasParent && parent && parent->isValid()) {
        // Use `FollowsFromRef` in place of `ChildOfRef`.
        hasParent = true;
    }

    if (hasParent) {
        assert(parent);
        result._parent = parent;
    }

    return result;
}